

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib4xor.hpp
# Opt level: O3

void __thiscall
trng::lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U>::discard
          (lagfib4xor<unsigned_int,_168U,_205U,_242U,_521U> *this,unsigned_long_long n)

{
  ushort uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  void *pvVar11;
  long lVar12;
  void *__s;
  pointer pGVar13;
  ulong uVar14;
  ulong uVar15;
  result_type_conflict sum;
  uint uVar16;
  uint uVar17;
  value_type_conflict4 *__val_1;
  long lVar18;
  size_type i;
  long lVar19;
  value_type_conflict4 *__val;
  int iVar20;
  int iVar22;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  pointer local_68;
  pointer pGStack_60;
  pointer local_58;
  undefined1 local_48 [16];
  pointer local_38;
  
  uVar15 = 0x3f;
  if (n != 0) {
    for (; n >> uVar15 == 0; uVar15 = uVar15 - 1) {
    }
  }
  uVar14 = 0;
  if (1 < n) {
    uVar14 = uVar15;
  }
  lVar18 = 1;
  uVar15 = (uVar15 ^ 0xffffffffffffffc0) + 0x41;
  if (n <= (ulong)(1L << ((byte)uVar14 & 0x3f))) {
    uVar15 = uVar14;
  }
  if (uVar15 * 0x86de8d9 < n) {
    pvVar11 = operator_new(0x42451);
    lVar19 = 0;
    local_68 = (pointer)pvVar11;
    local_58 = (pointer)((long)pvVar11 + 0x42451);
    memset(pvVar11,0,0x42451);
    auVar10 = _DAT_002a6210;
    auVar9 = _DAT_002a6200;
    auVar8 = _DAT_002a61f0;
    auVar7 = _DAT_002a61e0;
    auVar6 = _DAT_002a61d0;
    auVar5 = _DAT_002a61c0;
    auVar4 = _DAT_002a61b0;
    auVar3 = _DAT_002a00c0;
    auVar2 = _DAT_002a00b0;
    lVar12 = 0;
    do {
      auVar21._8_4_ = (int)lVar12;
      auVar21._0_8_ = lVar12;
      auVar21._12_4_ = (int)((ulong)lVar12 >> 0x20);
      auVar23 = (auVar21 | auVar2) ^ auVar3;
      iVar20 = auVar23._0_4_;
      iVar22 = auVar23._8_4_;
      auVar32._4_4_ = iVar20;
      auVar32._0_4_ = iVar20;
      auVar32._8_4_ = iVar22;
      auVar32._12_4_ = iVar22;
      auVar40._0_4_ = -(uint)(iVar20 < -0x7ffffdf8);
      auVar40._4_4_ = -(uint)(iVar20 < -0x7ffffdf8);
      auVar40._8_4_ = -(uint)(iVar22 < -0x7ffffdf8);
      auVar40._12_4_ = -(uint)(iVar22 < -0x7ffffdf8);
      auVar24._0_4_ = -(uint)(auVar23._4_4_ == -0x80000000);
      auVar24._4_4_ = -(uint)(auVar23._4_4_ == -0x80000000);
      auVar24._8_4_ = -(uint)(auVar23._12_4_ == -0x80000000);
      auVar24._12_4_ = -(uint)(auVar23._12_4_ == -0x80000000);
      auVar24 = auVar24 & auVar40;
      auVar23 = pshuflw(auVar32,auVar24,0xe8);
      auVar23 = packssdw(auVar23,auVar23);
      if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)pvVar11 + lVar18) = 1;
      }
      auVar23 = packssdw(auVar24,auVar24);
      auVar23 = packssdw(auVar23,auVar23);
      auVar23 = packsswb(auVar23,auVar23);
      if ((auVar23._0_4_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)pvVar11 + lVar18 + 0x20a) = 1;
      }
      auVar23 = (auVar21 | auVar10) ^ auVar3;
      iVar20 = auVar23._0_4_;
      iVar22 = auVar23._8_4_;
      auVar33._4_4_ = iVar20;
      auVar33._0_4_ = iVar20;
      auVar33._8_4_ = iVar22;
      auVar33._12_4_ = iVar22;
      auVar41._0_4_ = -(uint)(iVar20 < -0x7ffffdf8);
      auVar41._4_4_ = -(uint)(iVar20 < -0x7ffffdf8);
      auVar41._8_4_ = -(uint)(iVar22 < -0x7ffffdf8);
      auVar41._12_4_ = -(uint)(iVar22 < -0x7ffffdf8);
      auVar25._0_4_ = -(uint)(auVar23._4_4_ == -0x80000000);
      auVar25._4_4_ = -(uint)(auVar23._4_4_ == -0x80000000);
      auVar25._8_4_ = -(uint)(auVar23._12_4_ == -0x80000000);
      auVar25._12_4_ = -(uint)(auVar23._12_4_ == -0x80000000);
      auVar25 = auVar25 & auVar41;
      auVar23 = packssdw(auVar33,auVar25);
      auVar23 = packssdw(auVar23,auVar23);
      auVar23 = packsswb(auVar23,auVar23);
      if ((auVar23._0_4_ >> 0x10 & 1) != 0) {
        *(undefined1 *)((long)pvVar11 + lVar18 + 0x414) = 1;
      }
      auVar23 = pshufhw(auVar25,auVar25,0x84);
      auVar23 = packssdw(auVar23,auVar23);
      auVar23 = packsswb(auVar23,auVar23);
      if ((auVar23._0_4_ >> 0x18 & 1) != 0) {
        *(undefined1 *)((long)pvVar11 + lVar18 + 0x61e) = 1;
      }
      auVar23 = (auVar21 | auVar9) ^ auVar3;
      iVar20 = auVar23._0_4_;
      iVar22 = auVar23._8_4_;
      auVar34._4_4_ = iVar20;
      auVar34._0_4_ = iVar20;
      auVar34._8_4_ = iVar22;
      auVar34._12_4_ = iVar22;
      auVar42._0_4_ = -(uint)(iVar20 < -0x7ffffdf8);
      auVar42._4_4_ = -(uint)(iVar20 < -0x7ffffdf8);
      auVar42._8_4_ = -(uint)(iVar22 < -0x7ffffdf8);
      auVar42._12_4_ = -(uint)(iVar22 < -0x7ffffdf8);
      auVar26._0_4_ = -(uint)(auVar23._4_4_ == -0x80000000);
      auVar26._4_4_ = -(uint)(auVar23._4_4_ == -0x80000000);
      auVar26._8_4_ = -(uint)(auVar23._12_4_ == -0x80000000);
      auVar26._12_4_ = -(uint)(auVar23._12_4_ == -0x80000000);
      auVar26 = auVar26 & auVar42;
      auVar23 = pshuflw(auVar34,auVar26,0xe8);
      auVar23 = packssdw(auVar23,auVar23);
      auVar23 = packsswb(auVar23,auVar23);
      if ((auVar23 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)pvVar11 + lVar18 + 0x828) = 1;
      }
      auVar23 = packssdw(auVar26,auVar26);
      auVar23 = packssdw(auVar23,auVar23);
      auVar23 = packsswb(auVar23,auVar23);
      if ((auVar23._4_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)pvVar11 + lVar18 + 0xa32) = 1;
      }
      auVar23 = (auVar21 | auVar8) ^ auVar3;
      iVar20 = auVar23._0_4_;
      iVar22 = auVar23._8_4_;
      auVar35._4_4_ = iVar20;
      auVar35._0_4_ = iVar20;
      auVar35._8_4_ = iVar22;
      auVar35._12_4_ = iVar22;
      auVar43._0_4_ = -(uint)(iVar20 < -0x7ffffdf8);
      auVar43._4_4_ = -(uint)(iVar20 < -0x7ffffdf8);
      auVar43._8_4_ = -(uint)(iVar22 < -0x7ffffdf8);
      auVar43._12_4_ = -(uint)(iVar22 < -0x7ffffdf8);
      auVar27._0_4_ = -(uint)(auVar23._4_4_ == -0x80000000);
      auVar27._4_4_ = -(uint)(auVar23._4_4_ == -0x80000000);
      auVar27._8_4_ = -(uint)(auVar23._12_4_ == -0x80000000);
      auVar27._12_4_ = -(uint)(auVar23._12_4_ == -0x80000000);
      auVar27 = auVar27 & auVar43;
      auVar23 = packssdw(auVar35,auVar27);
      auVar23 = packssdw(auVar23,auVar23);
      auVar23 = packsswb(auVar23,auVar23);
      if ((auVar23 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)pvVar11 + lVar18 + 0xc3c) = 1;
      }
      auVar23 = pshufhw(auVar27,auVar27,0x84);
      auVar23 = packssdw(auVar23,auVar23);
      auVar23 = packsswb(auVar23,auVar23);
      if ((auVar23._6_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)pvVar11 + lVar18 + 0xe46) = 1;
      }
      auVar23 = (auVar21 | auVar7) ^ auVar3;
      iVar20 = auVar23._0_4_;
      iVar22 = auVar23._8_4_;
      auVar36._4_4_ = iVar20;
      auVar36._0_4_ = iVar20;
      auVar36._8_4_ = iVar22;
      auVar36._12_4_ = iVar22;
      auVar44._0_4_ = -(uint)(iVar20 < -0x7ffffdf8);
      auVar44._4_4_ = -(uint)(iVar20 < -0x7ffffdf8);
      auVar44._8_4_ = -(uint)(iVar22 < -0x7ffffdf8);
      auVar44._12_4_ = -(uint)(iVar22 < -0x7ffffdf8);
      auVar28._0_4_ = -(uint)(auVar23._4_4_ == -0x80000000);
      auVar28._4_4_ = -(uint)(auVar23._4_4_ == -0x80000000);
      auVar28._8_4_ = -(uint)(auVar23._12_4_ == -0x80000000);
      auVar28._12_4_ = -(uint)(auVar23._12_4_ == -0x80000000);
      auVar28 = auVar28 & auVar44;
      auVar23 = pshuflw(auVar36,auVar28,0xe8);
      auVar23 = packssdw(auVar23,auVar23);
      auVar23 = packsswb(auVar23,auVar23);
      if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)pvVar11 + lVar18 + 0x1050) = 1;
      }
      auVar23 = packssdw(auVar28,auVar28);
      auVar23 = packssdw(auVar23,auVar23);
      auVar23 = packsswb(auVar23,auVar23);
      if ((auVar23._8_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)pvVar11 + lVar18 + 0x125a) = 1;
      }
      auVar23 = (auVar21 | auVar6) ^ auVar3;
      iVar20 = auVar23._0_4_;
      iVar22 = auVar23._8_4_;
      auVar37._4_4_ = iVar20;
      auVar37._0_4_ = iVar20;
      auVar37._8_4_ = iVar22;
      auVar37._12_4_ = iVar22;
      auVar45._0_4_ = -(uint)(iVar20 < -0x7ffffdf8);
      auVar45._4_4_ = -(uint)(iVar20 < -0x7ffffdf8);
      auVar45._8_4_ = -(uint)(iVar22 < -0x7ffffdf8);
      auVar45._12_4_ = -(uint)(iVar22 < -0x7ffffdf8);
      auVar29._0_4_ = -(uint)(auVar23._4_4_ == -0x80000000);
      auVar29._4_4_ = -(uint)(auVar23._4_4_ == -0x80000000);
      auVar29._8_4_ = -(uint)(auVar23._12_4_ == -0x80000000);
      auVar29._12_4_ = -(uint)(auVar23._12_4_ == -0x80000000);
      auVar29 = auVar29 & auVar45;
      auVar23 = packssdw(auVar37,auVar29);
      auVar23 = packssdw(auVar23,auVar23);
      auVar23 = packsswb(auVar23,auVar23);
      if ((auVar23 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)pvVar11 + lVar18 + 0x1464) = 1;
      }
      auVar23 = pshufhw(auVar29,auVar29,0x84);
      auVar23 = packssdw(auVar23,auVar23);
      auVar23 = packsswb(auVar23,auVar23);
      if ((auVar23._10_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)pvVar11 + lVar18 + 0x166e) = 1;
      }
      auVar23 = (auVar21 | auVar5) ^ auVar3;
      iVar20 = auVar23._0_4_;
      iVar22 = auVar23._8_4_;
      auVar38._4_4_ = iVar20;
      auVar38._0_4_ = iVar20;
      auVar38._8_4_ = iVar22;
      auVar38._12_4_ = iVar22;
      auVar46._0_4_ = -(uint)(iVar20 < -0x7ffffdf8);
      auVar46._4_4_ = -(uint)(iVar20 < -0x7ffffdf8);
      auVar46._8_4_ = -(uint)(iVar22 < -0x7ffffdf8);
      auVar46._12_4_ = -(uint)(iVar22 < -0x7ffffdf8);
      auVar30._0_4_ = -(uint)(auVar23._4_4_ == -0x80000000);
      auVar30._4_4_ = -(uint)(auVar23._4_4_ == -0x80000000);
      auVar30._8_4_ = -(uint)(auVar23._12_4_ == -0x80000000);
      auVar30._12_4_ = -(uint)(auVar23._12_4_ == -0x80000000);
      auVar30 = auVar30 & auVar46;
      auVar23 = pshuflw(auVar38,auVar30,0xe8);
      auVar23 = packssdw(auVar23,auVar23);
      auVar23 = packsswb(auVar23,auVar23);
      if ((auVar23 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)pvVar11 + lVar18 + 0x1878) = 1;
      }
      auVar23 = packssdw(auVar30,auVar30);
      auVar23 = packssdw(auVar23,auVar23);
      auVar23 = packsswb(auVar23,auVar23);
      if ((auVar23._12_2_ >> 8 & 1) != 0) {
        *(undefined1 *)((long)pvVar11 + lVar18 + 0x1a82) = 1;
      }
      auVar21 = (auVar21 | auVar4) ^ auVar3;
      iVar20 = auVar21._0_4_;
      iVar22 = auVar21._8_4_;
      auVar31._4_4_ = iVar20;
      auVar31._0_4_ = iVar20;
      auVar31._8_4_ = iVar22;
      auVar31._12_4_ = iVar22;
      auVar39._0_4_ = -(uint)(iVar20 < -0x7ffffdf8);
      auVar39._4_4_ = -(uint)(iVar20 < -0x7ffffdf8);
      auVar39._8_4_ = -(uint)(iVar22 < -0x7ffffdf8);
      auVar39._12_4_ = -(uint)(iVar22 < -0x7ffffdf8);
      auVar23._0_4_ = -(uint)(auVar21._4_4_ == -0x80000000);
      auVar23._4_4_ = -(uint)(auVar21._4_4_ == -0x80000000);
      auVar23._8_4_ = -(uint)(auVar21._12_4_ == -0x80000000);
      auVar23._12_4_ = -(uint)(auVar21._12_4_ == -0x80000000);
      auVar23 = auVar23 & auVar39;
      auVar21 = packssdw(auVar31,auVar23);
      auVar21 = packssdw(auVar21,auVar21);
      auVar21 = packsswb(auVar21,auVar21);
      if ((auVar21 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        *(undefined1 *)((long)pvVar11 + lVar18 + 0x1c8c) = 1;
      }
      auVar21 = pshufhw(auVar23,auVar23,0x84);
      auVar21 = packssdw(auVar21,auVar21);
      auVar21 = packsswb(auVar21,auVar21);
      uVar1 = auVar21._14_2_ >> 8;
      if ((uVar1 & 1) != 0) {
        *(undefined1 *)((long)pvVar11 + lVar18 + 0x1e96) = 1;
      }
      lVar12 = lVar12 + 0x10;
      lVar18 = lVar18 + 0x20a0;
      lVar19 = lVar19 + 0x2090;
    } while (lVar19 != 0x43290);
    *(undefined1 *)((long)pvVar11 + 0x42248) = 1;
    *(undefined1 *)((long)pvVar11 + 0x4235f) = 1;
    *(undefined1 *)((long)pvVar11 + 0x42384) = 1;
    *(undefined1 *)((long)pvVar11 + 0x423a9) = 1;
    pGStack_60 = (pointer)((long)pvVar11 + 0x42451);
    power<trng::GF2,521ul>
              ((matrix<trng::GF2,_521UL> *)local_48,(trng *)&local_68,
               (matrix<trng::GF2,_521UL> *)(n - 0x209),(ulong)uVar1);
    pGVar13 = local_68;
    local_68 = (pointer)local_48._0_8_;
    pGStack_60 = (pointer)local_48._8_8_;
    local_58 = local_38;
    local_48 = (undefined1  [16])0x0;
    local_38 = (pointer)0x0;
    if (pGVar13 != (pointer)0x0) {
      operator_delete(pGVar13);
      if ((pointer)local_48._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_48._0_8_);
      }
    }
    pvVar11 = operator_new(0x824);
    lVar18 = 0;
    memset(pvVar11,0,0x824);
    uVar16 = (this->S).index;
    do {
      *(result_type_conflict *)((long)pvVar11 + lVar18 * 4 + 0x820) =
           (this->S).r[uVar16 + (int)lVar18 & 0x3ff];
      lVar18 = lVar18 + -1;
    } while (lVar18 != -0x209);
    __s = operator_new(0x824);
    lVar18 = 0;
    memset(__s,0,0x824);
    pGVar13 = local_68;
    do {
      lVar12 = 0;
      uVar16 = 0;
      do {
        uVar17 = 0;
        if (pGVar13[lVar12].value != '\0') {
          uVar17 = *(uint *)((long)pvVar11 + lVar12 * 4);
        }
        uVar16 = uVar16 ^ uVar17;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x209);
      *(uint *)((long)__s + lVar18 * 4) = uVar16;
      lVar18 = lVar18 + 1;
      pGVar13 = pGVar13 + 0x209;
    } while (lVar18 != 0x209);
    uVar16 = (int)(matrix<trng::GF2,_521UL> *)(n - 0x209) + (this->S).index;
    (this->S).index = uVar16 & 0x3ff;
    lVar18 = 0;
    do {
      (this->S).r[uVar16 + (int)lVar18 & 0x3ff] =
           *(result_type_conflict *)((long)__s + lVar18 * 4 + 0x820);
      lVar18 = lVar18 + -1;
    } while (lVar18 != -0x209);
    operator_delete(__s);
    operator_delete(pvVar11);
    if (local_68 != (pointer)0x0) {
      operator_delete(local_68);
    }
    n = 0x209;
  }
  else if (n == 0) {
    return;
  }
  uVar15 = (ulong)(this->S).index;
  do {
    iVar20 = (int)uVar15;
    uVar16 = iVar20 + 1U & 0x3ff;
    uVar15 = (ulong)uVar16;
    (this->S).r[uVar15] =
         (this->S).r[iVar20 + 0x334U & 0x3ff] ^ (this->S).r[iVar20 + 0x359U & 0x3ff] ^
         (this->S).r[iVar20 + 0x30fU & 0x3ff] ^ (this->S).r[iVar20 + 0x1f8U & 0x3ff];
    n = n - 1;
  } while (n != 0);
  (this->S).index = uVar16;
  return;
}

Assistant:

void discard(unsigned long long n) {
      const unsigned int matrix_size = D;
      using matrix_type = matrix<GF2, matrix_size>;
      using vector_type = vector<result_type, matrix_size>;
      using size_type = typename matrix_type::size_type;
      const unsigned long long n_pivot{int_math::log2_ceil(n) * D * D * D};
      constexpr auto mask = int_math::mask(D);
      if (n > n_pivot) {
        const unsigned long long n_partial{n - matrix_size};
        matrix_type M;
        for (size_type i{0}; i < matrix_size - 1; ++i)
          M(i, i + 1) = GF2(true);
        M(matrix_size - 1, matrix_size - D) = GF2(true);
        M(matrix_size - 1, matrix_size - C) = GF2(true);
        M(matrix_size - 1, matrix_size - B) = GF2(true);
        M(matrix_size - 1, matrix_size - A) = GF2(true);
        M = power(M, n_partial);
        vector_type V;
        for (size_type i{0}; i < matrix_size; ++i)
          V(matrix_size - 1 - i) = S.r[(S.index - i) & mask];
        vector_type W;
        for (size_type i{0}; i < matrix_size; ++i) {
          result_type sum{};
          for (size_type k{0}; k < matrix_size; ++k)
            sum ^= M(i, k) * V(k);
          W(i) = sum;
        }
        S.index = static_cast<unsigned int>(S.index + n_partial);
        S.index &= mask;
        for (size_type i{0}; i < matrix_size; ++i)
          S.r[(S.index - i) & mask] = W(matrix_size - 1 - i);
        n -= n_partial;
      }
      for (unsigned long long i{0}; i < n; ++i)
        step();
    }